

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void prf_messages_post_va(int type,int level,__va_list_tag *args)

{
  prf_msg_handler_t *ppVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char string [256];
  char acStack_138 [264];
  
  uVar3 = prf_array_count(prf_handlers[type]);
  if (0 < (int)uVar3) {
    uVar5 = 0;
    bVar2 = false;
    do {
      if ((prf_handlers[type][uVar5] != (prf_msg_handler_t *)0x0) &&
         (prf_handlers[type][uVar5]->level <= level)) {
        bVar2 = true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    if (bVar2) {
      uVar3 = args->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar3 + (long)args->reg_save_area);
        args->gp_offset = uVar3 + 8;
      }
      else {
        puVar4 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar4 + 1;
      }
      vsprintf(acStack_138,(char *)*puVar4,args);
      uVar3 = prf_array_count(prf_handlers[type]);
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          ppVar1 = prf_handlers[type][uVar5];
          if ((ppVar1 != (prf_msg_handler_t *)0x0) && (ppVar1->level <= level)) {
            (*ppVar1->func)(type,level,acStack_138,ppVar1->userdata);
          }
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
    }
  }
  return;
}

Assistant:

void
prf_messages_post_va(
    int type,
    int level,
    va_list args )
{
    bool_t present;
    int i, count;
    char string[ 256 ];
    assert( type > 0 && type < 6 );
    /* check that handler is present */
    present = FALSE;
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] != NULL &&
             prf_handlers[type][i]->level <= level ) {
            present = TRUE;
        }
    }
    if ( present == FALSE ) {
        return;
    }
    /* build string */
    do {
        char * format;
        format = va_arg( args, char * );
        vsprintf( string, format, args );
    } while ( FALSE );

    /* call handlers with string */
    count = prf_array_count( prf_handlers[ type ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[type][i] != NULL &&
             prf_handlers[type][i]->level <= level ) {
            (*(prf_handlers[type][i]->func))( type, level, string,
                 prf_handlers[type][i]->userdata );
        }
    }
}